

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture3DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int z_;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Texture3DView TVar20;
  float local_39c;
  float local_368;
  Vec4 local_328;
  Vector<float,_2> local_318;
  Vec2 local_310;
  Vec2 local_308;
  Vec2 clampedLod;
  Vec2 lodO;
  Vector<float,_3> local_2ec;
  undefined1 local_2e0 [8];
  Vec3 coordDyo;
  Vector<float,_3> local_2c8;
  undefined1 local_2bc [8];
  Vec3 coordDxo;
  float nyo;
  float nxo;
  float wyo;
  float wxo;
  int lodOffsNdx;
  Vec2 lodBounds;
  Vector<float,_3> local_288;
  undefined1 local_27c [8];
  Vec3 coordDy;
  Vector<float,_3> local_264;
  undefined1 local_258 [8];
  Vec3 coordDx;
  Vec3 coord;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  bool isOk;
  bool tri1;
  bool tri0;
  float ny;
  float nx;
  float wy;
  float wx;
  Vector<float,_4> local_208;
  Vector<bool,_4> local_1f8;
  undefined1 local_1f4 [16];
  Vector<float,_4> local_1e4;
  undefined1 local_1d4 [8];
  Vec4 refPix;
  Vector<float,_4> local_1b4;
  undefined1 local_1a4 [8];
  Vec4 resPix;
  int px;
  int py;
  Vector<float,_2> local_178;
  Vec2 lodOffsets [4];
  int numFailed;
  float posEps;
  Vec2 lodBias;
  Vec3 triW [2];
  undefined1 local_128 [8];
  Vec3 triR [2];
  undefined1 local_108 [8];
  Vec3 triT [2];
  undefined1 local_e8 [8];
  Vec3 triS [2];
  undefined1 local_c8 [8];
  IVec3 srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  Texture3DView local_70;
  undefined1 local_60 [8];
  Texture3DView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  Texture3DView *baseView_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *reference_local;
  ConstPixelBufferAccess *result_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar20 = getSubView(baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  local_70.m_levels = TVar20.m_levels;
  local_70.m_numLevels = TVar20.m_numLevels;
  TVar20 = tcu::getEffectiveTextureView
                     (&local_70,
                      (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)&src.m_levels,&sampleParams->sampler);
  src._0_8_ = TVar20.m_levels;
  local_60._0_4_ = TVar20.m_numLevels;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[3],texCoord[6],texCoord[9]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[4],texCoord[7],texCoord[10]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&dstSize,texCoord[2],texCoord[5],texCoord[8],texCoord[0xb]);
  iVar5 = tcu::ConstPixelBufferAccess::getWidth(result);
  iVar6 = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar5,iVar6);
  iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  srcSize.m_data[2] = (int)(float)iVar5;
  iVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  srcSize.m_data[1] = (int)(float)iVar5;
  iVar5 = tcu::Texture3DView::getWidth((Texture3DView *)local_60);
  iVar6 = tcu::Texture3DView::getHeight((Texture3DView *)local_60);
  z_ = tcu::Texture3DView::getDepth((Texture3DView *)local_60);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_c8,iVar5,iVar6,z_);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_e8,(int)&tq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)&tq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_108,(int)&rq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)&rq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_128,(int)&dstSize,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)&dstSize,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&lodBias,(int)sampleParams + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle
            ((Vector<float,_4> *)(triW[0].m_data + 1),(int)sampleParams + 0xc,3,2);
  if (((sampleParams->super_RenderParams).flags & 2) == 0) {
    local_368 = 0.0;
  }
  else {
    local_368 = (sampleParams->super_RenderParams).bias;
  }
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&numFailed,local_368);
  lodOffsets[3].m_data[1] = 0.0625;
  lodOffsets[3].m_data[0] = 0.0;
  tcu::Vector<float,_2>::Vector(&local_178,-1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets,1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 1,0.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 2,0.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(errorMask,(Vec4 *)&py);
  resPix.m_data[3] = 0.0;
  do {
    fVar8 = resPix.m_data[3];
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(result);
    fVar9 = lodOffsets[3].m_data[0];
    if (iVar5 <= (int)fVar8) {
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~vector((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
              &src.m_levels);
      return (int)fVar9;
    }
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    for (resPix.m_data[2] = 0.0; fVar8 = resPix.m_data[2],
        iVar5 = tcu::ConstPixelBufferAccess::getWidth(result), (int)fVar8 < iVar5;
        resPix.m_data[2] = (float)((int)resPix.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(refPix.m_data + 2),(int)result,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_1b4,(Vector<float,_4> *)(refPix.m_data + 2),
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_1a4,&local_1b4,&(sampleParams->super_RenderParams).colorScale);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1f4,(int)reference,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_1e4,(Vector<float,_4> *)local_1f4,
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_1d4,&local_1e4,&(sampleParams->super_RenderParams).colorScale);
      tcu::operator-((tcu *)&wy,(Vector<float,_4> *)local_1a4,(Vector<float,_4> *)local_1d4);
      tcu::abs<float,4>((tcu *)&local_208,(Vector<float,_4> *)&wy);
      tcu::lessThanEqual<float,4>((tcu *)&local_1f8,&local_208,&lookupPrec->colorThreshold);
      bVar3 = tcu::boolAll<4>(&local_1f8);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fVar8 = (float)(int)resPix.m_data[2] + 0.5;
        fVar9 = (float)(int)resPix.m_data[3] + 0.5;
        fVar10 = fVar8 / (float)srcSize.m_data[2];
        fVar11 = fVar9 / (float)srcSize.m_data[1];
        fVar12 = (fVar8 + 0.0625) / (float)srcSize.m_data[2];
        fVar19 = (fVar9 + 0.0625) / (float)srcSize.m_data[1];
        bVar3 = false;
        for (triWy = (float)(uint)(1.0 < (fVar8 - 0.0625) / (float)srcSize.m_data[2] +
                                         (fVar9 - 0.0625) / (float)srcSize.m_data[1]);
            (int)triWy <= (int)(uint)(1.0 <= fVar12 + fVar19); triWy = (float)((int)triWy + 1)) {
          local_39c = fVar11;
          fVar1 = fVar9;
          fVar2 = fVar8;
          fVar16 = fVar10;
          if (triWy != 0.0) {
            local_39c = 1.0 - fVar11;
            fVar1 = (float)srcSize.m_data[1] - fVar9;
            fVar2 = (float)srcSize.m_data[2] - fVar8;
            fVar16 = 1.0 - fVar10;
          }
          fVar13 = projectedTriInterpolate
                             ((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar16,local_39c);
          fVar14 = projectedTriInterpolate
                             ((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar16,local_39c);
          fVar15 = projectedTriInterpolate
                             ((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar16,local_39c);
          tcu::Vector<float,_3>::Vector
                    ((Vector<float,_3> *)(coordDx.m_data + 1),fVar13,fVar14,fVar15);
          fVar13 = triDerivateX((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                (float)srcSize.m_data[2],local_39c);
          fVar14 = triDerivateX((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                (float)srcSize.m_data[2],local_39c);
          fVar15 = triDerivateX((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                (float)srcSize.m_data[2],local_39c);
          tcu::Vector<float,_3>::Vector(&local_264,fVar13,fVar14,fVar15);
          tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)(coordDy.m_data + 1));
          tcu::operator*((tcu *)local_258,&local_264,(Vector<float,_3> *)(coordDy.m_data + 1));
          fVar13 = triDerivateY((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar9,
                                (float)srcSize.m_data[1],fVar16);
          fVar14 = triDerivateY((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar9,
                                (float)srcSize.m_data[1],fVar16);
          fVar16 = triDerivateY((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar9,
                                (float)srcSize.m_data[1],fVar16);
          tcu::Vector<float,_3>::Vector(&local_288,fVar13,fVar14,fVar16);
          tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)&lodBounds);
          tcu::operator*((tcu *)local_27c,&local_288,(Vector<float,_3> *)&lodBounds);
          fVar16 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_258);
          fVar13 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_258);
          fVar14 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_258);
          fVar15 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_27c);
          fVar17 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_27c);
          fVar18 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_27c);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&wxo,fVar16,fVar13,fVar14,fVar15,fVar17,fVar18,lodPrec);
          for (wyo = 0.0; (int)wyo < 4; wyo = (float)((int)wyo + 1)) {
            fVar16 = tcu::Vector<float,_2>::x(lodOffsets + (long)(int)wyo + -1);
            fVar16 = fVar2 + fVar16;
            fVar13 = tcu::Vector<float,_2>::y(lodOffsets + (long)(int)wyo + -1);
            fVar13 = fVar1 + fVar13;
            coordDxo.m_data[2] = fVar16 / (float)srcSize.m_data[2];
            coordDxo.m_data[1] = fVar13 / (float)srcSize.m_data[1];
            fVar14 = triDerivateX((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar16,
                                  (float)srcSize.m_data[2],coordDxo.m_data[1]);
            fVar15 = triDerivateX((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar16,
                                  (float)srcSize.m_data[2],coordDxo.m_data[1]);
            fVar16 = triDerivateX((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar16,
                                  (float)srcSize.m_data[2],coordDxo.m_data[1]);
            tcu::Vector<float,_3>::Vector(&local_2c8,fVar14,fVar15,fVar16);
            tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)(coordDyo.m_data + 1));
            tcu::operator*((tcu *)local_2bc,&local_2c8,(Vector<float,_3> *)(coordDyo.m_data + 1));
            fVar16 = triDerivateY((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,
                                  (float)srcSize.m_data[1],coordDxo.m_data[2]);
            fVar14 = triDerivateY((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,
                                  (float)srcSize.m_data[1],coordDxo.m_data[2]);
            fVar13 = triDerivateY((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,
                                  (float)srcSize.m_data[1],coordDxo.m_data[2]);
            tcu::Vector<float,_3>::Vector(&local_2ec,fVar16,fVar14,fVar13);
            tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)&lodO);
            tcu::operator*((tcu *)local_2e0,&local_2ec,(Vector<float,_3> *)&lodO);
            fVar16 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_2bc);
            fVar13 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_2bc);
            fVar14 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_2bc);
            fVar15 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_2e0);
            fVar17 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_2e0);
            fVar18 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_2e0);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&clampedLod,fVar16,fVar13,fVar14,fVar15,fVar17,fVar18,lodPrec);
            pfVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            fVar16 = *pfVar7;
            fVar13 = tcu::Vector<float,_2>::x(&clampedLod);
            fVar16 = de::min<float>(fVar16,fVar13);
            pfVar7 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            *pfVar7 = fVar16;
            pfVar7 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            fVar16 = *pfVar7;
            fVar13 = tcu::Vector<float,_2>::y(&clampedLod);
            fVar16 = de::max<float>(fVar16,fVar13);
            pfVar7 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            *pfVar7 = fVar16;
          }
          tcu::operator+((tcu *)&local_310,(Vector<float,_2> *)&wxo,(Vector<float,_2> *)&numFailed);
          tcu::Vector<float,_2>::Vector(&local_318,sampleParams->minLod,sampleParams->maxLod);
          tcu::clampLodBounds((tcu *)&local_308,&local_310,&local_318,lodPrec);
          bVar4 = tcu::isLookupResultValid
                            ((Texture3DView *)local_60,&sampleParams->sampler,lookupPrec,
                             (Vec3 *)(coordDx.m_data + 1),&local_308,(Vec4 *)local_1a4);
          if (bVar4) {
            bVar3 = true;
            break;
          }
        }
        if (!bVar3) {
          tcu::RGBA::red();
          tcu::RGBA::toVec((RGBA *)&local_328);
          tcu::PixelBufferAccess::setPixel
                    (errorMask,&local_328,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
          lodOffsets[3].m_data[0] = (float)((int)lodOffsets[3].m_data[0] + 1);
        }
      }
    }
    resPix.m_data[3] = (float)((int)resPix.m_data[3] + 1);
  } while( true );
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture3DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture3DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::IVec3							srcSize				= tcu::IVec3(src.getWidth(), src.getHeight(), src.getDepth());

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
					const tcu::Vec3	coordDy		= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

					tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDx.z(), coordDy.x(), coordDy.y(), coordDy.z(), lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordDxo	= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
						const tcu::Vec3	coordDyo	= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
						const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDxo.z(), coordDyo.x(), coordDyo.y(), coordDyo.z(), lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}